

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
::Simplex_boundary_enumerator::next
          (optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,Simplex_boundary_enumerator *this)

{
  long *plVar1;
  simplex_t *psVar2;
  char cVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *pBVar7;
  undefined1 idx [16];
  undefined1 index [16];
  simplex_t sVar8;
  simplex_t sVar9;
  bool bVar10;
  byte bVar11;
  vertex_t vVar12;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 unaff_RBX;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined8 unaff_R12;
  long lVar23;
  value_t vVar24;
  
  if (this->k < '\0') {
    bVar10 = false;
  }
  else {
    idx._8_8_ = unaff_R12;
    idx._0_8_ = unaff_RBX;
    vVar12 = Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::
             get_max_vertex(this->simplex_encoding,(simplex_t)idx,(dimension_t)(long)this->idx_below
                            ,(vertex_t)*(undefined8 *)((long)&this->idx_below + 8));
    this->j = vVar12;
    uVar4 = (ulong)this->idx_above;
    lVar5 = *(long *)((long)&this->idx_above + 8);
    if (this->k == -1) {
      uVar13 = 0;
      uVar17 = 1;
    }
    else {
      uVar19 = (ulong)vVar12;
      uVar16 = (int)this->k * this->simplex_encoding->bits_per_vertex;
      bVar14 = (byte)uVar16;
      bVar11 = bVar14 & 0x3f;
      uVar20 = uVar19 << (bVar14 & 0x3f);
      uVar17 = 0;
      uVar13 = uVar20;
      if ((uVar16 & 0x40) == 0) {
        uVar13 = ((long)uVar19 >> 0x3f) << bVar11 | uVar19 >> 0x40 - bVar11;
        uVar17 = uVar20;
      }
    }
    uVar20 = uVar4 - uVar17;
    sVar8 = this->idx_below;
    lVar23 = uVar20 + (long)this->idx_below;
    lVar6 = *(long *)((long)&this->idx_below + 8);
    index._8_8_ = unaff_R12;
    index._0_8_ = unaff_RBX;
    vVar24 = compute_diameter(this->parent,(simplex_t)index,(dimension_t)lVar23);
    cVar3 = this->k;
    pBVar7 = this->simplex_encoding;
    uVar19 = (ulong)this->j;
    if (cVar3 == -1) {
      uVar21 = 0;
      uVar18 = 1;
    }
    else {
      uVar16 = pBVar7->bits_per_vertex * (int)cVar3;
      bVar14 = (byte)uVar16;
      bVar11 = bVar14 & 0x3f;
      uVar22 = uVar19 << (bVar14 & 0x3f);
      uVar18 = 0;
      uVar21 = uVar22;
      if ((uVar16 & 0x40) == 0) {
        uVar21 = ((long)uVar19 >> 0x3f) << bVar11 | uVar19 >> 0x40 - bVar11;
        uVar18 = uVar22;
      }
    }
    sVar9 = this->idx_below;
    *(ulong *)&this->idx_below = (long)this->idx_below - uVar18;
    plVar1 = (long *)((long)&this->idx_below + 8);
    *plVar1 = (*plVar1 - uVar21) - (ulong)((ulong)sVar9 < uVar18);
    if (cVar3 == '\0') {
      bVar11 = 0xff;
      uVar21 = 1;
      uVar18 = 0;
    }
    else {
      bVar11 = cVar3 - 1;
      uVar16 = (uint)bVar11 * pBVar7->bits_per_vertex;
      bVar15 = (byte)uVar16;
      bVar14 = bVar15 & 0x3f;
      uVar18 = uVar19 << (bVar15 & 0x3f);
      uVar21 = 0;
      if ((uVar16 & 0x40) == 0) {
        uVar21 = uVar18;
        uVar18 = ((long)uVar19 >> 0x3f) << bVar14 | uVar19 >> 0x40 - bVar14;
      }
    }
    psVar2 = &this->idx_above;
    sVar9 = *psVar2;
    *(ulong *)psVar2 = (long)*psVar2 + uVar21;
    plVar1 = (long *)((long)&this->idx_above + 8);
    *plVar1 = *plVar1 + uVar18 + (ulong)CARRY8((ulong)sVar9,uVar21);
    this->k = bVar11;
    (__return_storage_ptr__->
    super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
    )._M_payload.
    super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
    ._M_payload._M_value.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
    .first = vVar24;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
                     )._M_payload.
                     super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
                     ._M_payload + 0x10) = lVar23;
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
                      )._M_payload.
                      super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
                      ._M_payload + 0x18) =
         ((lVar5 - (ulong)(uVar4 < uVar17)) + lVar6 + (ulong)CARRY8(uVar20,(ulong)sVar8)) - uVar13;
    bVar10 = true;
  }
  (__return_storage_ptr__->
  super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
  )._M_payload.
  super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
  ._M_engaged = bVar10;
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> next() {
        if (!has_next()) return std::nullopt;
        j = simplex_encoding.get_max_vertex(idx_below, k + 1, j);

        simplex_t face_index = idx_above - simplex_encoding(j, k + 1) + idx_below;

        // It would make sense to extract the vertices once in set_simplex
        // and pass the proper subset to compute_diameter, but even in cases
        // where this dominates it does not seem to help (probably because we
        // stop at the first coface).
        value_t face_diameter = parent.compute_diameter(face_index, dim - 1);

        const coefficient_t modulus = parent.modulus;
        coefficient_t face_coefficient =
          (k & 1 ? -1 + modulus : 1) * parent.get_coefficient(simplex) % modulus;

        idx_below -= simplex_encoding(j, k + 1);
        idx_above += simplex_encoding(j, k);

        --k;

        return parent.make_diameter_entry(face_diameter, face_index, face_coefficient);
      }